

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

cbtDbvtNode * __thiscall cbtDbvt::insert(cbtDbvt *this,cbtDbvtVolume *volume,void *data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cbtDbvtNode *leaf;
  
  leaf = this->m_free;
  if (leaf == (cbtDbvtNode *)0x0) {
    leaf = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
    (leaf->volume).mi.m_floats[0] = 0.0;
    (leaf->volume).mi.m_floats[1] = 0.0;
    (leaf->volume).mi.m_floats[2] = 0.0;
    (leaf->volume).mi.m_floats[3] = 0.0;
    (leaf->volume).mx.m_floats[0] = 0.0;
    (leaf->volume).mx.m_floats[1] = 0.0;
    (leaf->volume).mx.m_floats[2] = 0.0;
    (leaf->volume).mx.m_floats[3] = 0.0;
    (leaf->volume).mx.m_floats[2] = 0.0;
    (leaf->volume).mx.m_floats[3] = 0.0;
    leaf->parent = (cbtDbvtNode *)0x0;
    (leaf->field_2).childs[0] = (cbtDbvtNode *)0x0;
    (leaf->field_2).childs[1] = (cbtDbvtNode *)0x0;
  }
  else {
    this->m_free = (cbtDbvtNode *)0x0;
  }
  leaf->parent = (cbtDbvtNode *)0x0;
  (leaf->field_2).data = data;
  (leaf->field_2).childs[1] = (cbtDbvtNode *)0x0;
  uVar1 = *(undefined8 *)((volume->mi).m_floats + 2);
  uVar2 = *(undefined8 *)(volume->mx).m_floats;
  uVar3 = *(undefined8 *)((volume->mx).m_floats + 2);
  *(undefined8 *)(leaf->volume).mi.m_floats = *(undefined8 *)(volume->mi).m_floats;
  *(undefined8 *)((leaf->volume).mi.m_floats + 2) = uVar1;
  *(undefined8 *)(leaf->volume).mx.m_floats = uVar2;
  *(undefined8 *)((leaf->volume).mx.m_floats + 2) = uVar3;
  insertleaf(this,this->m_root,leaf);
  this->m_leaves = this->m_leaves + 1;
  return leaf;
}

Assistant:

cbtDbvtNode* cbtDbvt::insert(const cbtDbvtVolume& volume, void* data)
{
	cbtDbvtNode* leaf = createnode(this, 0, volume, data);
	insertleaf(this, m_root, leaf);
	++m_leaves;
	return (leaf);
}